

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::addDefine(SceneRender *this,string *_define,string *_value)

{
  pointer ppMVar1;
  ulong uVar2;
  
  vera::HaveDefines::addDefine(&(this->m_background_shader).super_HaveDefines,_define,_value);
  vera::Model::addDefine(&this->m_floor,_define,_value);
  ppMVar1 = (this->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppMVar1) {
    uVar2 = 0;
    do {
      (*(ppMVar1[uVar2]->mainShader).super_HaveDefines._vptr_HaveDefines[10])
                (&ppMVar1[uVar2]->mainShader,_define,_value);
      uVar2 = uVar2 + 1;
      ppMVar1 = (this->m_devlook_spheres).
                super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->m_devlook_spheres).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3))
    ;
  }
  ppMVar1 = (this->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppMVar1) {
    uVar2 = 0;
    do {
      (*(ppMVar1[uVar2]->mainShader).super_HaveDefines._vptr_HaveDefines[10])
                (&ppMVar1[uVar2]->mainShader,_define,_value);
      uVar2 = uVar2 + 1;
      ppMVar1 = (this->m_devlook_billboards).
                super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->m_devlook_billboards).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3))
    ;
  }
  return;
}

Assistant:

void SceneRender::addDefine(const std::string& _define, const std::string& _value) {
    m_background_shader.addDefine(_define, _value);
    m_floor.addDefine(_define, _value);

    for (size_t i = 0; i < m_devlook_spheres.size(); i++)
        m_devlook_spheres[i]->getShader()->addDefine(_define, _value);

    for (size_t i = 0; i < m_devlook_billboards.size(); i++)
        m_devlook_billboards[i]->getShader()->addDefine(_define, _value);
}